

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O0

unique_ptr<verilogAST::Cast,_std::default_delete<verilogAST::Cast>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::Cast,_std::default_delete<verilogAST::Cast>_> *node)

{
  pointer pCVar1;
  unique_ptr<verilogAST::Cast,_std::default_delete<verilogAST::Cast>_> *in_RDX;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_30;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_28 [2];
  unique_ptr<verilogAST::Cast,_std::default_delete<verilogAST::Cast>_> *node_local;
  Transformer *this_local;
  
  node_local = node;
  this_local = this;
  pCVar1 = std::unique_ptr<verilogAST::Cast,_std::default_delete<verilogAST::Cast>_>::operator->
                     (in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::unique_ptr
            (&local_30,&pCVar1->expr);
  (*(code *)(((node->_M_t).
              super___uniq_ptr_impl<verilogAST::Cast,_std::default_delete<verilogAST::Cast>_>._M_t.
              super__Tuple_impl<0UL,_verilogAST::Cast_*,_std::default_delete<verilogAST::Cast>_>.
              super__Head_base<0UL,_verilogAST::Cast_*,_false>._M_head_impl)->super_Expression).
            super_Node)(local_28,node,&local_30);
  pCVar1 = std::unique_ptr<verilogAST::Cast,_std::default_delete<verilogAST::Cast>_>::operator->
                     (in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::operator=
            (&pCVar1->expr,local_28);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (local_28);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (&local_30);
  std::unique_ptr<verilogAST::Cast,_std::default_delete<verilogAST::Cast>_>::unique_ptr
            ((unique_ptr<verilogAST::Cast,_std::default_delete<verilogAST::Cast>_> *)this,in_RDX);
  return (__uniq_ptr_data<verilogAST::Cast,_std::default_delete<verilogAST::Cast>,_true,_true>)
         (__uniq_ptr_data<verilogAST::Cast,_std::default_delete<verilogAST::Cast>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Cast> Transformer::visit(std::unique_ptr<Cast> node) {
  node->expr = this->visit(std::move(node->expr));
  return node;
}